

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_select.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ListSelectBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  undefined8 uVar2;
  bool bVar3;
  reference pvVar4;
  pointer pEVar5;
  reference this_00;
  LogicalType *pLVar6;
  LogicalType local_78;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_60;
  LogicalType child_type;
  LogicalType local_40;
  
  pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,0);
  local_60._M_head_impl =
       (pvVar4->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
       .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar4->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  BoundCastExpression::AddArrayCastToList
            ((BoundCastExpression *)&child_type,context,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_60);
  pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,0);
  uVar2 = child_type._0_8_;
  child_type.id_ = INVALID;
  child_type.physical_type_ = ~INVALID;
  child_type._2_6_ = 0;
  _Var1._M_head_impl =
       (pvVar4->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
       .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar4->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar2;
  if (_Var1._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
  }
  if (child_type._0_8_ != 0) {
    (**(code **)(*(long *)child_type._0_8_ + 8))();
  }
  child_type.id_ = INVALID;
  child_type.physical_type_ = ~INVALID;
  child_type._2_6_ = 0;
  if (local_60._M_head_impl != (Expression *)0x0) {
    (*((local_60._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_60._M_head_impl = (Expression *)0x0;
  LogicalType::LogicalType(&child_type);
  pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,0);
  pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar4);
  LogicalType::LogicalType(&local_78,UNKNOWN);
  bVar3 = LogicalType::operator==(&pEVar5->return_type,&local_78);
  if (bVar3) {
    LogicalType::~LogicalType(&local_78);
  }
  else {
    pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,1);
    pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar4);
    LogicalType::LogicalType(&local_40,UNKNOWN);
    bVar3 = LogicalType::operator==(&pEVar5->return_type,&local_40);
    LogicalType::~LogicalType(&local_40);
    LogicalType::~LogicalType(&local_78);
    if (!bVar3) {
      pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>(arguments,0);
      pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar4);
      pLVar6 = &(bound_function->super_BaseScalarFunction).return_type;
      LogicalType::operator=(pLVar6,&pEVar5->return_type);
      make_uniq<duckdb::VariableReturnBindData,duckdb::LogicalType&>((duckdb *)&local_78,pLVar6);
      goto LAB_017acdcc;
    }
  }
  LogicalType::LogicalType(&local_78,UNKNOWN);
  this_00 = vector<duckdb::LogicalType,_true>::get<true>
                      (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments,0)
  ;
  LogicalType::operator=(this_00,&local_78);
  LogicalType::~LogicalType(&local_78);
  LogicalType::LogicalType(&local_78,SQLNULL);
  pLVar6 = &(bound_function->super_BaseScalarFunction).return_type;
  LogicalType::operator=(pLVar6,&local_78);
  LogicalType::~LogicalType(&local_78);
  make_uniq<duckdb::VariableReturnBindData,duckdb::LogicalType&>((duckdb *)&local_78,pLVar6);
LAB_017acdcc:
  *(undefined8 *)this = local_78._0_8_;
  LogicalType::~LogicalType(&child_type);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> ListSelectBind(ClientContext &context, ScalarFunction &bound_function,
                                               vector<unique_ptr<Expression>> &arguments) {
	D_ASSERT(bound_function.arguments.size() == 2);

	// If the first argument is an array, cast it to a list
	arguments[0] = BoundCastExpression::AddArrayCastToList(context, std::move(arguments[0]));

	LogicalType child_type;
	if (arguments[0]->return_type == LogicalTypeId::UNKNOWN || arguments[1]->return_type == LogicalTypeId::UNKNOWN) {
		bound_function.arguments[0] = LogicalTypeId::UNKNOWN;
		bound_function.return_type = LogicalType::SQLNULL;
		return make_uniq<VariableReturnBindData>(bound_function.return_type);
	}

	D_ASSERT(LogicalTypeId::LIST == arguments[0]->return_type.id() ||
	         LogicalTypeId::SQLNULL == arguments[0]->return_type.id());

	bound_function.return_type = arguments[0]->return_type;
	return make_uniq<VariableReturnBindData>(bound_function.return_type);
}